

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall TestAds::testAdsWriteReqEx(TestAds *this,string *param_1)

{
  long lVar1;
  ostream *poVar2;
  bool bVar3;
  bool bVar4;
  test_root local_270;
  test_root local_250;
  undefined4 local_22c;
  undefined1 local_228 [4];
  uint32_t defaultValue;
  test_root local_208;
  test_root local_1e8;
  test_root local_1c8;
  test_root local_1a8;
  test_root local_188;
  test_root local_168;
  test_root local_148;
  AmsNetId local_128 [6];
  undefined2 local_122;
  AmsAddr unknown;
  test_root local_100;
  test_root local_e0;
  test_root local_c0;
  test_root local_a0;
  test_root local_80;
  int local_5c;
  uint local_58;
  int i;
  uint32_t outBuffer;
  uint32_t buffer;
  uint32_t bytesRead;
  test_root local_40;
  long local_20;
  long port;
  string *param_1_local;
  TestAds *this_local;
  
  port = (long)param_1;
  param_1_local = (string *)this;
  local_20 = AdsPortOpenEx();
  bVar3 = local_20 != 0;
  fructose::test_root::get_test_name_abi_cxx11_(&local_40);
  fructose::test_root::test_assert
            ((test_root *)this,bVar3,(string *)&local_40,"0 != port",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x259);
  std::__cxx11::string::~string((string *)&local_40);
  print(&server,this->out);
  local_58 = 0xdeadbeef;
  for (local_5c = 0; local_5c < 10; local_5c = local_5c + 1) {
    fructose::test_root::set_assertion_tested((test_root *)this);
    lVar1 = AdsSyncWriteReqEx(local_20,(AmsAddr *)&server,0x4020,0,4,&local_58);
    bVar3 = fructose::test_root::reverse_mode((test_root *)this);
    if ((lVar1 == 0) == bVar3) {
      poVar2 = std::operator<<((ostream *)&std::cout,"i");
      poVar2 = std::operator<<(poVar2,": ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_5c);
      std::operator<<(poVar2,"\n");
      bVar3 = fructose::test_root::reverse_mode((test_root *)this);
      fructose::test_root::get_test_name_abi_cxx11_(&local_80);
      fructose::test_root::test_assert
                ((test_root *)this,bVar3,(string *)&local_80,
                 "0 == AdsSyncWriteReqEx(port, &server, 0x4020, 0, sizeof(outBuffer), &outBuffer)",
                 "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
                 ,0x261);
      std::__cxx11::string::~string((string *)&local_80);
    }
    fructose::test_root::set_assertion_tested((test_root *)this);
    lVar1 = AdsSyncReadReqEx2(local_20,(AmsAddr *)&server,0x4020,0,4,&i,&outBuffer);
    bVar3 = fructose::test_root::reverse_mode((test_root *)this);
    if ((lVar1 == 0) == bVar3) {
      poVar2 = std::operator<<((ostream *)&std::cout,"i");
      poVar2 = std::operator<<(poVar2,": ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_5c);
      std::operator<<(poVar2,"\n");
      bVar3 = fructose::test_root::reverse_mode((test_root *)this);
      fructose::test_root::get_test_name_abi_cxx11_(&local_a0);
      fructose::test_root::test_assert
                ((test_root *)this,bVar3,(string *)&local_a0,
                 "0 == AdsSyncReadReqEx2(port, &server, 0x4020, 0, sizeof(buffer), &buffer, &bytesRead)"
                 ,
                 "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
                 ,0x268);
      std::__cxx11::string::~string((string *)&local_a0);
    }
    fructose::test_root::set_assertion_tested((test_root *)this);
    bVar4 = outBuffer == 4;
    bVar3 = fructose::test_root::reverse_mode((test_root *)this);
    if (bVar4 == bVar3) {
      poVar2 = std::operator<<((ostream *)&std::cout,"i");
      poVar2 = std::operator<<(poVar2,": ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_5c);
      std::operator<<(poVar2,"\n");
      bVar3 = fructose::test_root::reverse_mode((test_root *)this);
      fructose::test_root::get_test_name_abi_cxx11_(&local_c0);
      fructose::test_root::test_assert
                ((test_root *)this,bVar3,(string *)&local_c0,"sizeof(buffer) == bytesRead",
                 "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
                 ,0x269);
      std::__cxx11::string::~string((string *)&local_c0);
    }
    fructose::test_root::set_assertion_tested((test_root *)this);
    bVar4 = local_58 == i;
    bVar3 = fructose::test_root::reverse_mode((test_root *)this);
    if (bVar4 == bVar3) {
      poVar2 = std::operator<<((ostream *)&std::cout,"i");
      poVar2 = std::operator<<(poVar2,": ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_5c);
      std::operator<<(poVar2,"\n");
      bVar3 = fructose::test_root::reverse_mode((test_root *)this);
      fructose::test_root::get_test_name_abi_cxx11_(&local_e0);
      fructose::test_root::test_assert
                ((test_root *)this,bVar3,(string *)&local_e0,"outBuffer == buffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
                 ,0x26a);
      std::__cxx11::string::~string((string *)&local_e0);
    }
    local_58 = local_58 ^ 0xffffffff;
  }
  lVar1 = AdsSyncWriteReqEx(0,(AmsAddr *)&server,0x4020,0,4,&local_58);
  fructose::test_root::get_test_name_abi_cxx11_(&local_100);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 0x748,(string *)&local_100,
             "ADSERR_CLIENT_PORTNOTOPEN == AdsSyncWriteReqEx(0, &server, 0x4020, 0, sizeof(outBuffer), &outBuffer)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x270);
  std::__cxx11::string::~string((string *)&local_100);
  lVar1 = AdsSyncWriteReqEx(local_20,(AmsAddr *)0x0,0x4020,0,4,&local_58);
  fructose::test_root::get_test_name_abi_cxx11_((test_root *)&unknown);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 0x749,(string *)&unknown,
             "ADSERR_CLIENT_NOAMSADDR == AdsSyncWriteReqEx(port, nullptr, 0x4020, 0, sizeof(outBuffer), &outBuffer)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x274);
  std::__cxx11::string::~string((string *)&unknown);
  AmsNetId::AmsNetId(local_128,'\x01','\x02','\x03','\x04','\x05','\x06');
  local_122 = 0x353;
  lVar1 = AdsSyncWriteReqEx(local_20,(AmsAddr *)local_128,0x4020,0,4,&local_58);
  fructose::test_root::get_test_name_abi_cxx11_(&local_148);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 7,(string *)&local_148,
             "GLOBALERR_MISSING_ROUTE == AdsSyncWriteReqEx(port, &unknown, 0x4020, 0, sizeof(outBuffer), &outBuffer)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x279);
  std::__cxx11::string::~string((string *)&local_148);
  lVar1 = AdsSyncWriteReqEx(local_20,(AmsAddr *)&server,0x4020,0,4,(void *)0x0);
  fructose::test_root::get_test_name_abi_cxx11_(&local_168);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 0x741,(string *)&local_168,
             "ADSERR_CLIENT_INVALIDPARM == AdsSyncWriteReqEx(port, &server, 0x4020, 0, sizeof(outBuffer), nullptr)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x27d);
  std::__cxx11::string::~string((string *)&local_168);
  local_58 = 0xdeadbeef;
  i = 0;
  lVar1 = AdsSyncWriteReqEx(local_20,(AmsAddr *)&server,0x4020,0,4,&local_58);
  fructose::test_root::get_test_name_abi_cxx11_(&local_188);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 0,(string *)&local_188,
             "0 == AdsSyncWriteReqEx(port, &server, 0x4020, 0, sizeof(outBuffer), &outBuffer)",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x282);
  std::__cxx11::string::~string((string *)&local_188);
  lVar1 = AdsSyncWriteReqEx(local_20,(AmsAddr *)&server,0x4020,0,0,&i);
  fructose::test_root::get_test_name_abi_cxx11_(&local_1a8);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 0,(string *)&local_1a8,
             "0 == AdsSyncWriteReqEx(port, &server, 0x4020, 0, 0, &buffer)",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x283);
  std::__cxx11::string::~string((string *)&local_1a8);
  lVar1 = AdsSyncReadReqEx2(local_20,(AmsAddr *)&server,0x4020,0,4,&i,&outBuffer);
  fructose::test_root::get_test_name_abi_cxx11_(&local_1c8);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 0,(string *)&local_1c8,
             "0 == AdsSyncReadReqEx2(port, &server, 0x4020, 0, sizeof(buffer), &buffer, &bytesRead)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x284);
  std::__cxx11::string::~string((string *)&local_1c8);
  bVar3 = local_58 == i;
  fructose::test_root::get_test_name_abi_cxx11_(&local_1e8);
  fructose::test_root::test_assert
            ((test_root *)this,bVar3,(string *)&local_1e8,"outBuffer == buffer",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x285);
  std::__cxx11::string::~string((string *)&local_1e8);
  lVar1 = AdsSyncWriteReqEx(local_20,(AmsAddr *)&server,0,0,4,&local_58);
  fructose::test_root::get_test_name_abi_cxx11_(&local_208);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 0x701,(string *)&local_208,
             "ADSERR_DEVICE_SRVNOTSUPP == AdsSyncWriteReqEx(port, &server, 0, 0, sizeof(outBuffer), &outBuffer)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x28d);
  std::__cxx11::string::~string((string *)&local_208);
  lVar1 = AdsSyncWriteReqEx(local_20,(AmsAddr *)&server,0x4025,0x10000,4,&local_58);
  fructose::test_root::get_test_name_abi_cxx11_((test_root *)local_228);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 0x701,(string *)local_228,
             "ADSERR_DEVICE_SRVNOTSUPP == AdsSyncWriteReqEx(port, &server, 0x4025, 0x10000, sizeof(outBuffer), &outBuffer)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x291);
  std::__cxx11::string::~string((string *)local_228);
  local_22c = 0;
  lVar1 = AdsSyncWriteReqEx(local_20,(AmsAddr *)&server,0x4020,0,4,&local_22c);
  fructose::test_root::get_test_name_abi_cxx11_(&local_250);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 0,(string *)&local_250,
             "0 == AdsSyncWriteReqEx(port, &server, 0x4020, 0, sizeof(defaultValue), &defaultValue)"
             ,"/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp"
             ,0x294);
  std::__cxx11::string::~string((string *)&local_250);
  lVar1 = AdsPortCloseEx(local_20);
  fructose::test_root::get_test_name_abi_cxx11_(&local_270);
  fructose::test_root::test_assert
            ((test_root *)this,lVar1 == 0,(string *)&local_270,"0 == AdsPortCloseEx(port)",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0x295);
  std::__cxx11::string::~string((string *)&local_270);
  return;
}

Assistant:

void testAdsWriteReqEx(const std::string&)
    {
        const long port = AdsPortOpenEx();
        fructose_assert(0 != port);

        print(server, out);

        uint32_t bytesRead;
        uint32_t buffer;
        uint32_t outBuffer = 0xDEADBEEF;
        for (int i = 0; i < NUM_TEST_LOOPS; ++i) {
            fructose_loop_assert(i, 0 == AdsSyncWriteReqEx(port, &server, 0x4020, 0, sizeof(outBuffer), &outBuffer));
            fructose_loop_assert(i, 0 == AdsSyncReadReqEx2(port,
                                                           &server,
                                                           0x4020,
                                                           0,
                                                           sizeof(buffer),
                                                           &buffer,
                                                           &bytesRead));
            fructose_loop_assert(i, sizeof(buffer) == bytesRead);
            fructose_loop_assert(i, outBuffer == buffer);
            outBuffer = ~outBuffer;
        }

        // provide out of range port
        fructose_assert(ADSERR_CLIENT_PORTNOTOPEN ==
                        AdsSyncWriteReqEx(0, &server, 0x4020, 0, sizeof(outBuffer), &outBuffer));

        // provide nullptr to AmsAddr
        fructose_assert(ADSERR_CLIENT_NOAMSADDR ==
                        AdsSyncWriteReqEx(port, nullptr, 0x4020, 0, sizeof(outBuffer), &outBuffer));

        // provide unknown AmsAddr
        AmsAddr unknown { { 1, 2, 3, 4, 5, 6 }, AMSPORT_R0_PLC_TC3 };
        fructose_assert(GLOBALERR_MISSING_ROUTE ==
                        AdsSyncWriteReqEx(port, &unknown, 0x4020, 0, sizeof(outBuffer), &outBuffer));

        // provide nullptr to writeBuffer
        fructose_assert(ADSERR_CLIENT_INVALIDPARM ==
                        AdsSyncWriteReqEx(port, &server, 0x4020, 0, sizeof(outBuffer), nullptr));

        // provide 0 length writeBuffer
        outBuffer = 0xDEADBEEF;
        buffer = 0;
        fructose_assert(0 == AdsSyncWriteReqEx(port, &server, 0x4020, 0, sizeof(outBuffer), &outBuffer));
        fructose_assert(0 == AdsSyncWriteReqEx(port, &server, 0x4020, 0, 0, &buffer));
        fructose_assert(0 == AdsSyncReadReqEx2(port, &server, 0x4020, 0, sizeof(buffer), &buffer, &bytesRead));
        fructose_assert(outBuffer == buffer);

        // provide invalid indexGroup
        fructose_assert(ADSERR_DEVICE_SRVNOTSUPP == AdsSyncWriteReqEx(port,
                                                                      &server,
                                                                      0,
                                                                      0,
                                                                      sizeof(outBuffer),
                                                                      &outBuffer));

        // provide invalid indexOffset
        fructose_assert(ADSERR_DEVICE_SRVNOTSUPP ==
                        AdsSyncWriteReqEx(port, &server, 0x4025, 0x10000, sizeof(outBuffer), &outBuffer));

        const uint32_t defaultValue = 0;
        fructose_assert(0 == AdsSyncWriteReqEx(port, &server, 0x4020, 0, sizeof(defaultValue), &defaultValue));
        fructose_assert(0 == AdsPortCloseEx(port));
    }